

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

vector<AddedNodeInfo,_std::allocator<AddedNodeInfo>_> * __thiscall
CConnman::GetAddedNodeInfo
          (vector<AddedNodeInfo,_std::allocator<AddedNodeInfo>_> *__return_storage_ptr__,
          CConnman *this,bool include_connected)

{
  string *addr;
  CAddress *__k;
  ConnectionType CVar1;
  pointer ppCVar2;
  CNode *pCVar3;
  pointer pcVar4;
  DNSLookupFn dns_lookup_function;
  bool bVar5;
  uint16_t portDefault;
  mapped_type_conflict *pmVar6;
  mapped_type *pmVar7;
  iterator iVar8;
  iterator iVar9;
  undefined4 uVar10;
  undefined7 in_register_00000011;
  _Base_ptr p_Var11;
  _List_node_base *p_Var12;
  pointer ppCVar13;
  long in_FS_OFFSET;
  list<AddedNodeParams,_std::allocator<AddedNodeParams>_> lAddresses;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock81;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock80;
  string addrName;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_CService>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_CService>_>_>_>
  mapConnectedByName;
  map<CService,_bool,_std::less<CService>,_std::allocator<std::pair<const_CService,_bool>_>_>
  mapConnected;
  undefined4 in_stack_fffffffffffffe90;
  undefined8 in_stack_fffffffffffffea0;
  code *local_150;
  _List_base<AddedNodeParams,_std::allocator<AddedNodeParams>_> local_140;
  unique_lock<std::recursive_mutex> local_128;
  undefined1 local_118 [8];
  undefined1 local_110 [24];
  bool local_f8;
  undefined7 uStack_f7;
  direct_or_indirect local_f0;
  uint local_e0;
  Network local_d8;
  uint32_t uStack_d4;
  uint16_t local_d0;
  undefined2 local_c8;
  direct_or_indirect local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  uint16_t local_a0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_CService>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_CService>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_CService>_>_>_>
  local_98;
  _Rb_tree<CService,_std::pair<const_CService,_bool>,_std::_Select1st<std::pair<const_CService,_bool>_>,_std::less<CService>,_std::allocator<std::pair<const_CService,_bool>_>_>
  local_68;
  long local_38;
  
  uVar10 = (undefined4)CONCAT71(in_register_00000011,include_connected);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->super__Vector_base<AddedNodeInfo,_std::allocator<AddedNodeInfo>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<AddedNodeInfo,_std::allocator<AddedNodeInfo>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<AddedNodeInfo,_std::allocator<AddedNodeInfo>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_140._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_140;
  local_140._M_impl._M_node._M_size = 0;
  local_118 = (undefined1  [8])&this->m_added_nodes_mutex;
  local_110[0] = false;
  local_140._M_impl._M_node.super__List_node_base._M_prev =
       local_140._M_impl._M_node.super__List_node_base._M_next;
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_118);
  std::vector<AddedNodeInfo,_std::allocator<AddedNodeInfo>_>::reserve
            (__return_storage_ptr__,
             ((long)(this->m_added_node_params).
                    super__Vector_base<AddedNodeParams,_std::allocator<AddedNodeParams>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->m_added_node_params).
                    super__Vector_base<AddedNodeParams,_std::allocator<AddedNodeParams>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) * -0x3333333333333333);
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<AddedNodeParams_const*,std::back_insert_iterator<std::__cxx11::list<AddedNodeParams,std::allocator<AddedNodeParams>>>>
            ((this->m_added_node_params).
             super__Vector_base<AddedNodeParams,_std::allocator<AddedNodeParams>_>._M_impl.
             super__Vector_impl_data._M_start,
             (this->m_added_node_params).
             super__Vector_base<AddedNodeParams,_std::allocator<AddedNodeParams>_>._M_impl.
             super__Vector_impl_data._M_finish,
             (list<AddedNodeParams,_std::allocator<AddedNodeParams>_> *)&local_140);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_118);
  local_68._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_68._M_impl.super__Rb_tree_header._M_header;
  local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_98._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_98._M_impl.super__Rb_tree_header._M_header;
  local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_128._M_device = &(this->m_nodes_mutex).super_recursive_mutex;
  local_128._M_owns = false;
  local_98._M_impl.super__Rb_tree_header._M_header._M_right =
       local_98._M_impl.super__Rb_tree_header._M_header._M_left;
  local_68._M_impl.super__Rb_tree_header._M_header._M_right =
       local_68._M_impl.super__Rb_tree_header._M_header._M_left;
  std::unique_lock<std::recursive_mutex>::lock(&local_128);
  ppCVar13 = (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppCVar2 = (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppCVar13 != ppCVar2) {
    do {
      pCVar3 = *ppCVar13;
      __k = &pCVar3->addr;
      bVar5 = CNetAddr::IsValid((CNetAddr *)__k);
      if (bVar5) {
        CVar1 = pCVar3->m_conn_type;
        pmVar6 = std::
                 map<CService,_bool,_std::less<CService>,_std::allocator<std::pair<const_CService,_bool>_>_>
                 ::operator[]((map<CService,_bool,_std::less<CService>,_std::allocator<std::pair<const_CService,_bool>_>_>
                               *)&local_68,&__k->super_CService);
        *pmVar6 = CVar1 == INBOUND;
      }
      pcVar4 = (pCVar3->m_addr_name)._M_dataplus._M_p;
      local_c0.indirect_contents.indirect = (char *)&local_b0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c0,pcVar4,pcVar4 + (pCVar3->m_addr_name)._M_string_length);
      if (local_c0._8_8_ != 0) {
        local_118[0] = pCVar3->m_conn_type == INBOUND;
        prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                  ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_110,
                   (prevector<16U,_unsigned_char,_unsigned_int,_int> *)__k);
        _local_f8 = *(undefined8 *)&(pCVar3->addr).super_CService.super_CNetAddr.m_net;
        local_f0._0_2_ = (pCVar3->addr).super_CService.port;
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_CService>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_CService>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_CService>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_CService>_>_>_>
                               *)&local_98,(key_type *)&local_c0.indirect_contents);
        pmVar7->first = (bool)local_118[0];
        if (0x10 < (pmVar7->second).super_CNetAddr.m_addr._size) {
          free((pmVar7->second).super_CNetAddr.m_addr._union.indirect_contents.indirect);
        }
        (pmVar7->second).super_CNetAddr.m_addr._union.indirect_contents.indirect =
             (char *)CONCAT71(local_110._1_7_,local_110[0]);
        *(ulong *)((long)&(pmVar7->second).super_CNetAddr.m_addr._union + 8) =
             CONCAT44(local_110._12_4_,local_110._8_4_);
        (pmVar7->second).super_CNetAddr.m_addr._size = local_110._16_4_;
        local_110._16_4_ = 0;
        *(undefined8 *)&(pmVar7->second).super_CNetAddr.m_net = _local_f8;
        (pmVar7->second).port = local_f0._0_2_;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0.indirect_contents.indirect != &local_b0) {
        operator_delete(local_c0.indirect_contents.indirect,
                        CONCAT44(local_b0._M_allocated_capacity._4_4_,
                                 local_b0._M_allocated_capacity._0_4_) + 1);
      }
      ppCVar13 = ppCVar13 + 1;
    } while (ppCVar13 != ppCVar2);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_128);
  if (local_140._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_140) {
    p_Var12 = local_140._M_impl._M_node.super__List_node_base._M_next;
    do {
      addr = (string *)(p_Var12 + 1);
      portDefault = GetDefaultPort(this,addr);
      std::
      function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
      ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                  *)&stack0xfffffffffffffea0,&g_dns_lookup_abi_cxx11_);
      dns_lookup_function.super__Function_base._M_functor._8_4_ = in_stack_fffffffffffffe90;
      dns_lookup_function.super__Function_base._M_functor._M_unused._M_object =
           __return_storage_ptr__;
      dns_lookup_function.super__Function_base._M_functor._12_4_ = uVar10;
      dns_lookup_function.super__Function_base._M_manager = (_Manager_type)this;
      dns_lookup_function._M_invoker = (_Invoker_type)in_stack_fffffffffffffea0;
      LookupNumeric((CService *)local_118,addr,portDefault,dns_lookup_function);
      MaybeFlipIPv6toCJDNS((CService *)&local_c0.indirect_contents,(CService *)local_118);
      if (0x10 < (uint)local_110._8_4_) {
        free((void *)local_118);
        local_118 = (undefined1  [8])0x0;
      }
      if (local_150 != (code *)0x0) {
        (*local_150)((_Any_data *)&stack0xfffffffffffffea0,(_Any_data *)&stack0xfffffffffffffea0,
                     __destroy_functor);
      }
      local_118 = (undefined1  [8])(local_110 + 8);
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_118,p_Var12[1]._M_next,
                 (long)&(p_Var12[1]._M_prev)->_M_next + (long)p_Var12[1]._M_next);
      local_f8 = *(bool *)&(((_List_impl *)&p_Var12[3]._M_next)->_M_node).super__List_node_base.
                           _M_next;
      CService::CService((CService *)&local_f0.indirect_contents);
      local_c8._0_1_ = false;
      local_c8._1_1_ = false;
      bVar5 = CNetAddr::IsValid((CNetAddr *)&local_c0.indirect_contents);
      if (bVar5) {
        iVar8 = std::
                _Rb_tree<CService,_std::pair<const_CService,_bool>,_std::_Select1st<std::pair<const_CService,_bool>_>,_std::less<CService>,_std::allocator<std::pair<const_CService,_bool>_>_>
                ::find(&local_68,(key_type *)&local_c0.indirect_contents);
        if ((_Rb_tree_header *)iVar8._M_node != &local_68._M_impl.super__Rb_tree_header) {
          if ((char)uVar10 == '\0') goto LAB_001a8f8b;
          prevector<16U,_unsigned_char,_unsigned_int,_int>::operator=
                    ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_f0.indirect_contents
                     ,(prevector<16U,_unsigned_char,_unsigned_int,_int> *)
                      &local_c0.indirect_contents);
          local_d8 = local_b0._8_4_;
          uStack_d4 = local_b0._12_4_;
          local_d0 = local_a0;
          p_Var11 = (_Base_ptr)&iVar8._M_node[2]._M_parent;
LAB_001a8f74:
          local_c8._1_1_ = *(bool *)&p_Var11->_M_color;
          local_c8._0_1_ = true;
        }
LAB_001a8f7f:
        std::vector<AddedNodeInfo,_std::allocator<AddedNodeInfo>_>::emplace_back<AddedNodeInfo>
                  (__return_storage_ptr__,(AddedNodeInfo *)local_118);
      }
      else {
        iVar9 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_CService>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_CService>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_CService>_>_>_>
                ::find(&local_98,addr);
        if ((_Rb_tree_header *)iVar9._M_node == &local_98._M_impl.super__Rb_tree_header)
        goto LAB_001a8f7f;
        if ((char)uVar10 != '\0') {
          prevector<16U,_unsigned_char,_unsigned_int,_int>::operator=
                    ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_f0.indirect_contents
                     ,(prevector<16U,_unsigned_char,_unsigned_int,_int> *)
                      &iVar9._M_node[2]._M_parent);
          local_d8 = iVar9._M_node[3]._M_color;
          uStack_d4 = *(uint32_t *)&iVar9._M_node[3].field_0x4;
          local_d0 = *(uint16_t *)&iVar9._M_node[3]._M_parent;
          p_Var11 = iVar9._M_node + 2;
          goto LAB_001a8f74;
        }
      }
LAB_001a8f8b:
      if (0x10 < local_e0) {
        free(local_f0.indirect_contents.indirect);
        local_f0.indirect_contents.indirect = (char *)0x0;
      }
      if (local_118 != (undefined1  [8])(local_110 + 8)) {
        operator_delete((void *)local_118,CONCAT44(local_110._12_4_,local_110._8_4_) + 1);
      }
      if (0x10 < (uint)local_b0._M_allocated_capacity._0_4_) {
        free(local_c0.indirect_contents.indirect);
      }
      p_Var12 = (((_List_impl *)&p_Var12->_M_next)->_M_node).super__List_node_base._M_next;
    } while (p_Var12 != (_List_node_base *)&local_140);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_CService>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_CService>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_CService>_>_>_>
  ::~_Rb_tree(&local_98);
  std::
  _Rb_tree<CService,_std::pair<const_CService,_bool>,_std::_Select1st<std::pair<const_CService,_bool>_>,_std::less<CService>,_std::allocator<std::pair<const_CService,_bool>_>_>
  ::~_Rb_tree(&local_68);
  std::__cxx11::_List_base<AddedNodeParams,_std::allocator<AddedNodeParams>_>::_M_clear(&local_140);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<AddedNodeInfo> CConnman::GetAddedNodeInfo(bool include_connected) const
{
    std::vector<AddedNodeInfo> ret;

    std::list<AddedNodeParams> lAddresses(0);
    {
        LOCK(m_added_nodes_mutex);
        ret.reserve(m_added_node_params.size());
        std::copy(m_added_node_params.cbegin(), m_added_node_params.cend(), std::back_inserter(lAddresses));
    }


    // Build a map of all already connected addresses (by IP:port and by name) to inbound/outbound and resolved CService
    std::map<CService, bool> mapConnected;
    std::map<std::string, std::pair<bool, CService>> mapConnectedByName;
    {
        LOCK(m_nodes_mutex);
        for (const CNode* pnode : m_nodes) {
            if (pnode->addr.IsValid()) {
                mapConnected[pnode->addr] = pnode->IsInboundConn();
            }
            std::string addrName{pnode->m_addr_name};
            if (!addrName.empty()) {
                mapConnectedByName[std::move(addrName)] = std::make_pair(pnode->IsInboundConn(), static_cast<const CService&>(pnode->addr));
            }
        }
    }

    for (const auto& addr : lAddresses) {
        CService service{MaybeFlipIPv6toCJDNS(LookupNumeric(addr.m_added_node, GetDefaultPort(addr.m_added_node)))};
        AddedNodeInfo addedNode{addr, CService(), false, false};
        if (service.IsValid()) {
            // strAddNode is an IP:port
            auto it = mapConnected.find(service);
            if (it != mapConnected.end()) {
                if (!include_connected) {
                    continue;
                }
                addedNode.resolvedAddress = service;
                addedNode.fConnected = true;
                addedNode.fInbound = it->second;
            }
        } else {
            // strAddNode is a name
            auto it = mapConnectedByName.find(addr.m_added_node);
            if (it != mapConnectedByName.end()) {
                if (!include_connected) {
                    continue;
                }
                addedNode.resolvedAddress = it->second.second;
                addedNode.fConnected = true;
                addedNode.fInbound = it->second.first;
            }
        }
        ret.emplace_back(std::move(addedNode));
    }

    return ret;
}